

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

bool __thiscall iDynTree::Model::isLinkNameUsed(Model *this,string *linkName)

{
  __type _Var1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  ulong local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_20 = 0;
  __lhs = in_RDI;
  while( true ) {
    sVar2 = getNrOfLinks((Model *)0x449949);
    if (sVar2 <= local_20) {
      return false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[3]._M_string_length,local_20);
    _Var1 = std::operator==(__lhs,in_RSI);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool Model::isLinkNameUsed(const std::string linkName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( linkName == linkNames[i] )
        {
            return true;
        }
    }

    return false;
}